

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O2

easm_expr * getrbf(rbitfield *bf,ull *a,ull *m)

{
  anon_enum_32 aVar1;
  byte bVar2;
  ull uVar3;
  easm_expr *peVar4;
  easm_expr *peVar5;
  byte bVar6;
  long lVar7;
  int iVar8;
  uint64_t num;
  
  iVar8 = bf->shr;
  num = 0;
  for (lVar7 = 0; bVar6 = (byte)iVar8, lVar7 != 2; lVar7 = lVar7 + 1) {
    uVar3 = bf_(bf->sbf[lVar7].pos,bf->sbf[lVar7].len,a,m);
    num = num | uVar3 << (bVar6 & 0x3f);
    iVar8 = iVar8 + bf->sbf[lVar7].len;
  }
  aVar1 = bf->mode;
  if (aVar1 != RBF_ULTRASIGNED) {
    if (aVar1 == RBF_SLIGHTLY_SIGNED) {
      if ((num >> ((ulong)(byte)(bVar6 - 1) & 0x3f) & 1) == 0) goto LAB_00243bfe;
      bVar2 = bVar6 - 2;
    }
    else {
      if (aVar1 != RBF_SIGNED) goto LAB_00243bfe;
      bVar2 = bVar6 - 1;
    }
    if ((num >> ((ulong)bVar2 & 0x3f) & 1) == 0) goto LAB_00243bfe;
  }
  num = num + (-1L << (bVar6 & 0x3f));
LAB_00243bfe:
  if (bf->pcrel == 0) {
    peVar4 = easm_expr_num(EASM_EXPR_NUM,num + bf->addend);
    return peVar4;
  }
  peVar4 = easm_expr_simple(EASM_EXPR_POS);
  if (bf->pospreadd != 0) {
    peVar5 = easm_expr_num(EASM_EXPR_NUM,bf->pospreadd);
    peVar4 = easm_expr_bin(EASM_EXPR_ADD,peVar4,peVar5);
  }
  if (bf->shr != 0) {
    peVar5 = easm_expr_num(EASM_EXPR_NUM,-1L << ((byte)bf->shr & 0x3f));
    peVar4 = easm_expr_bin(EASM_EXPR_AND,peVar4,peVar5);
  }
  peVar5 = easm_expr_num(EASM_EXPR_NUM,num);
  peVar4 = easm_expr_bin(EASM_EXPR_ADD,peVar4,peVar5);
  if (bf->addend != 0) {
    peVar5 = easm_expr_num(EASM_EXPR_NUM,bf->addend);
    peVar4 = easm_expr_bin(EASM_EXPR_ADD,peVar4,peVar5);
    return peVar4;
  }
  return peVar4;
}

Assistant:

struct easm_expr *getrbf(const struct rbitfield *bf, ull *a, ull *m) {
	ull res = 0;
	int pos = bf->shr;
	int i;
	for (i = 0; i < sizeof(bf->sbf) / sizeof(bf->sbf[0]); i++) {
		res |= BF(bf->sbf[i].pos, bf->sbf[i].len) << pos;
		pos += bf->sbf[i].len;
	}
	switch (bf->mode) {
		case RBF_UNSIGNED:
			break;
		case RBF_SIGNED:
			if (res & 1ull << (pos - 1))
				res -= 1ull << pos;
			break;
		case RBF_SLIGHTLY_SIGNED:
			if (res & 1ull << (pos - 1) && res & 1ull << (pos - 2))
				res -= 1ull << pos;
			break;
		case RBF_ULTRASIGNED:
			res -= 1ull << pos;
			break;
	}
	if (bf->pcrel) {
		struct easm_expr *expr = easm_expr_simple(EASM_EXPR_POS);
		if (bf->pospreadd)
			expr = easm_expr_bin(EASM_EXPR_ADD, expr, easm_expr_num(EASM_EXPR_NUM, bf->pospreadd));
		if (bf->shr)
			expr = easm_expr_bin(EASM_EXPR_AND, expr, easm_expr_num(EASM_EXPR_NUM, -(1ull << bf->shr)));
		expr = easm_expr_bin(EASM_EXPR_ADD, expr, easm_expr_num(EASM_EXPR_NUM, res));
		if (bf->addend)
			expr = easm_expr_bin(EASM_EXPR_ADD, expr, easm_expr_num(EASM_EXPR_NUM, bf->addend));
		return expr;
	} else {
		res += bf->addend;
		return easm_expr_num(EASM_EXPR_NUM, res);
	}
}